

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaParseIncludeOrRedefine
              (xmlSchemaParserCtxtPtr pctxt,xmlSchemaPtr schema,xmlNodePtr node,int type)

{
  byte *pbVar1;
  _xmlAttr *p_Var2;
  bool bVar3;
  bool bVar4;
  xmlSchemaPtr schema_00;
  int iVar5;
  int iVar6;
  xmlAttrPtr pxVar7;
  xmlSchemaTypePtr attr;
  xmlChar *pxVar8;
  xmlChar *name;
  undefined4 in_register_0000000c;
  xmlNodePtr pxVar9;
  long lVar10;
  xmlSchemaBasicItemPtr extraout_RDX;
  xmlSchemaBasicItemPtr ownerComp;
  xmlSchemaBasicItemPtr extraout_RDX_00;
  xmlParserErrors error;
  xmlChar **in_R8;
  char *in_R9;
  char *pcVar11;
  xmlNodePtr node_00;
  xmlChar *schemaLocation;
  xmlSchemaBucketPtr_conflict bucket;
  xmlChar *local_48;
  _xmlSchemaType *local_40;
  xmlSchemaPtr local_38;
  
  pxVar9 = (xmlNodePtr)CONCAT44(in_register_0000000c,type);
  local_48 = (xmlChar *)0x0;
  local_40 = (_xmlSchemaType *)0x0;
  local_38 = schema;
  for (p_Var2 = node->properties; p_Var2 != (_xmlAttr *)0x0; p_Var2 = p_Var2->next) {
    if (p_Var2->ns == (xmlNs *)0x0) {
      iVar5 = xmlStrEqual(p_Var2->name,"id");
      if ((iVar5 == 0) &&
         (iVar5 = xmlStrEqual(p_Var2->name,"schemaLocation"), ownerComp = extraout_RDX_00,
         iVar5 == 0)) goto LAB_001b74cf;
    }
    else {
      iVar5 = xmlStrEqual(p_Var2->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
      ownerComp = extraout_RDX;
      if (iVar5 != 0) {
LAB_001b74cf:
        xmlSchemaPIllegalAttrErr(pctxt,(xmlParserErrors)p_Var2,ownerComp,(xmlAttrPtr)pxVar9);
      }
    }
  }
  pxVar7 = xmlSchemaGetPropNode(node,"id");
  if (pxVar7 != (xmlAttrPtr)0x0) {
    xmlSchemaPValAttrNodeID(pctxt,pxVar7);
  }
  pxVar7 = xmlSchemaGetPropNode(node,"schemaLocation");
  if (pxVar7 == (xmlAttrPtr)0x0) {
    xmlSchemaPMissingAttrErr
              (pctxt,(xmlParserErrors)node,(xmlSchemaBasicItemPtr)0x1fc793,pxVar9,(char *)in_R8,
               in_R9);
    iVar5 = pctxt->err;
  }
  else {
    attr = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI);
    iVar5 = xmlSchemaPValAttrNode
                      (pctxt,(xmlSchemaBasicItemPtr)pxVar7,(xmlAttrPtr)attr,
                       (xmlSchemaTypePtr)&local_48,in_R8);
    lVar10 = 4;
    if (iVar5 != 0) {
LAB_001b75ed:
      iVar5 = (*(code *)((long)&DAT_001fb110 + (long)(int)(&DAT_001fb110)[lVar10]))();
      return iVar5;
    }
    pxVar8 = xmlNodeGetBase(node->doc,node);
    if (pxVar8 == (xmlChar *)0x0) {
      name = xmlBuildURI(local_48,node->doc->URL);
    }
    else {
      name = xmlBuildURI(local_48,pxVar8);
      (*xmlFree)(pxVar8);
    }
    if (name != (xmlChar *)0x0) {
      local_48 = xmlDictLookup(pctxt->dict,name,-1);
      (*xmlFree)(name);
      lVar10 = 0;
      goto LAB_001b75ed;
    }
    xmlSchemaInternalErr2
              ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaParseIncludeOrRedefine",
               "could not build an URI from the schemaLocation",(xmlChar *)0x0,(xmlChar *)in_R8);
    iVar5 = -1;
  }
  if (iVar5 != 0) {
    return iVar5;
  }
  pxVar9 = node;
  iVar5 = xmlSchemaAddSchemaDoc
                    (pctxt,type,local_48,(xmlDocPtr)0x0,(char *)0x0,0,node,pctxt->targetNamespace,
                     (xmlChar *)0x0,(xmlSchemaBucketPtr_conflict *)&local_40);
  if (iVar5 != 0) {
    return iVar5;
  }
  if ((local_40 == (_xmlSchemaType *)0x0) || ((xmlDocPtr)local_40->ref == (xmlDocPtr)0x0)) {
    if (type == 2) {
      pcVar11 = "Failed to load the document \'%s\' for inclusion";
      iVar5 = 0xbea;
      error = XML_SCHEMAP_SRC_INCLUDE;
    }
    else {
      pcVar11 = "Failed to load the document \'%s\' for redefinition";
      iVar5 = 0xc09;
      error = XML_SCHEMAP_SRC_REDEFINE;
    }
    pxVar9 = (xmlNodePtr)0x0;
    xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)pctxt,error,node,(xmlSchemaBasicItemPtr)0x0,
                        pcVar11,local_48,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
    bVar3 = true;
  }
  else {
    pxVar8 = pctxt->targetNamespace;
    if (local_40->name == (xmlChar *)0x0) {
      if (pxVar8 != (xmlChar *)0x0) {
        local_40->id = pxVar8;
        iVar5 = 0;
        bVar3 = false;
        goto LAB_001b77c5;
      }
    }
    else {
      if (pxVar8 == (xmlChar *)0x0) {
        xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_SRC_INCLUDE,node,
                            (xmlSchemaBasicItemPtr)0x0,
                            "The target namespace of the included/redefined schema \'%s\' has to be absent, since the including/redefining schema has no target namespace"
                            ,local_48,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
LAB_001b7b5c:
        return pctxt->err;
      }
      iVar5 = xmlStrEqual(local_40->name,pxVar8);
      if (iVar5 == 0) {
        xmlSchemaPCustomErrExt
                  (pctxt,XML_SCHEMAP_SRC_INCLUDE,(xmlSchemaBasicItemPtr)0x0,node,
                   "The target namespace \'%s\' of the included/redefined schema \'%s\' differs from \'%s\' of the including/redefining schema"
                   ,local_40->name,local_48,pctxt->targetNamespace);
        goto LAB_001b7b5c;
      }
    }
    bVar3 = true;
    iVar5 = 0;
  }
LAB_001b77c5:
  if (((local_40 != (_xmlSchemaType *)0x0) && (*(int *)((long)&local_40->annot + 4) == 0)) &&
     ((xmlDocPtr)local_40->ref != (xmlDocPtr)0x0)) {
    if (bVar3) {
      bVar4 = false;
    }
    else {
      bVar4 = true;
      if (((uint)local_38->flags >> 9 & 1) == 0) {
        local_38->flags = local_38->flags | 0x200;
        bVar4 = false;
      }
    }
    xmlSchemaParseNewDoc(pctxt,local_38,(xmlSchemaBucketPtr_conflict)local_40);
    if (!bVar3 && !bVar4) {
      pbVar1 = (byte *)((long)&local_38->flags + 1);
      *pbVar1 = *pbVar1 ^ 2;
    }
  }
  schema_00 = local_38;
  node_00 = node->children;
  if (type == 3) {
    pctxt->redefined = (xmlSchemaBucketPtr_conflict)local_40;
    pctxt->isRedefine = 1;
    while ((node_00 != (xmlNodePtr)0x0 &&
           ((((((node_00->ns != (xmlNs *)0x0 &&
                (iVar6 = xmlStrEqual(node_00->name,"annotation"), iVar6 != 0)) &&
               (iVar6 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
               , iVar6 != 0)) ||
              (((node_00->ns != (xmlNs *)0x0 &&
                (iVar6 = xmlStrEqual(node_00->name,"simpleType"), iVar6 != 0)) &&
               (iVar6 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
               , iVar6 != 0)))) ||
             (((node_00->ns != (xmlNs *)0x0 &&
               (iVar6 = xmlStrEqual(node_00->name,(xmlChar *)"complexType"), iVar6 != 0)) &&
              (iVar6 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
              iVar6 != 0)))) ||
            ((((node_00->ns != (xmlNs *)0x0 &&
               (iVar6 = xmlStrEqual(node_00->name,"group"), iVar6 != 0)) &&
              (iVar6 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
              iVar6 != 0)) ||
             (((node_00->ns != (xmlNs *)0x0 &&
               (iVar6 = xmlStrEqual(node_00->name,(xmlChar *)"attributeGroup"), iVar6 != 0)) &&
              (iVar6 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
              iVar6 != 0))))))))) {
      if (((node_00->ns == (xmlNs *)0x0) ||
          (iVar6 = xmlStrEqual(node_00->name,"annotation"), iVar6 == 0)) ||
         (iVar6 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
         iVar6 == 0)) {
        if (((node_00->ns == (xmlNs *)0x0) ||
            (iVar6 = xmlStrEqual(node_00->name,"simpleType"), iVar6 == 0)) ||
           (iVar6 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
           iVar6 == 0)) {
          if (((node_00->ns == (xmlNs *)0x0) ||
              (iVar6 = xmlStrEqual(node_00->name,(xmlChar *)"complexType"), iVar6 == 0)) ||
             (iVar6 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
             iVar6 == 0)) {
            if (((node_00->ns == (xmlNs *)0x0) ||
                (iVar6 = xmlStrEqual(node_00->name,"group"), iVar6 == 0)) ||
               (iVar6 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
               , iVar6 == 0)) {
              if (((node_00->ns != (xmlNs *)0x0) &&
                  (iVar6 = xmlStrEqual(node_00->name,(xmlChar *)"attributeGroup"), iVar6 != 0)) &&
                 (iVar6 = xmlStrEqual(node_00->ns->href,
                                      (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 != 0)) {
                xmlSchemaParseAttributeGroupDefinition(pctxt,schema_00,node_00);
              }
            }
            else {
              xmlSchemaParseModelGroupDefinition(pctxt,schema_00,node_00);
            }
          }
          else {
            xmlSchemaParseComplexType(pctxt,schema_00,node_00,1);
          }
        }
        else {
          xmlSchemaParseSimpleType(pctxt,schema_00,node_00,1);
        }
      }
      node_00 = node_00->next;
    }
    pctxt->redefined = (xmlSchemaBucketPtr_conflict)0x0;
    pctxt->isRedefine = 0;
  }
  else if (node_00 == (xmlNodePtr)0x0) {
    node_00 = (xmlNodePtr)0x0;
  }
  else if (((node_00->ns != (xmlNs *)0x0) &&
           (iVar6 = xmlStrEqual(node_00->name,"annotation"), iVar6 != 0)) &&
          (iVar6 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
          iVar6 != 0)) {
    node_00 = node_00->next;
  }
  if (node_00 != (xmlNodePtr)0x0) {
    if (type == 3) {
      pcVar11 = "(annotation | (simpleType | complexType | group | attributeGroup))*";
    }
    else {
      pcVar11 = "(annotation?)";
    }
    iVar5 = 0xbd9;
    xmlSchemaPContentErr
              (pctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,node_00,
               (xmlNodePtr)0x0,pcVar11,(char *)pxVar9);
  }
  return iVar5;
}

Assistant:

static int
xmlSchemaParseIncludeOrRedefine(xmlSchemaParserCtxtPtr pctxt,
				xmlSchemaPtr schema,
				xmlNodePtr node,
				int type)
{
    xmlNodePtr child = NULL;
    const xmlChar *schemaLocation = NULL;
    int res = 0; /* hasRedefinitions = 0 */
    int isChameleon = 0, wasChameleon = 0;
    xmlSchemaBucketPtr bucket = NULL;

    if ((pctxt == NULL) || (schema == NULL) || (node == NULL))
        return (-1);

    /*
    * Parse attributes. Note that the returned schemaLocation will
    * be already converted to an absolute URI.
    */
    res = xmlSchemaParseIncludeOrRedefineAttrs(pctxt, schema,
	node, (xmlChar **) (&schemaLocation), type);
    if (res != 0)
	return(res);
    /*
    * Load and add the schema document.
    */
    res = xmlSchemaAddSchemaDoc(pctxt, type, schemaLocation, NULL,
	NULL, 0, node, pctxt->targetNamespace, NULL, &bucket);
    if (res != 0)
	return(res);
    /*
    * If we get no schema bucket back, then this means that the schema
    * document could not be located or was broken XML or was not
    * a schema document.
    */
    if ((bucket == NULL) || (bucket->doc == NULL)) {
	if (type == XML_SCHEMA_SCHEMA_INCLUDE) {
	    /*
	    * WARNING for <include>:
	    * We will raise an error if the schema cannot be located
	    * for inclusions, since the that was the feedback from the
	    * schema people. I.e. the following spec piece will *not* be
	    * satisfied:
	    * SPEC src-include: "It is not an error for the `actual value` of the
	    * schemaLocation [attribute] to fail to resolve it all, in which
	    * case no corresponding inclusion is performed.
	    * So do we need a warning report here?"
	    */
	    res = XML_SCHEMAP_SRC_INCLUDE;
	    xmlSchemaCustomErr(ACTXT_CAST pctxt, res,
		node, NULL,
		"Failed to load the document '%s' for inclusion",
		schemaLocation, NULL);
	} else {
	    /*
	    * NOTE: This was changed to raise an error even if no redefinitions
	    * are specified.
	    *
	    * SPEC src-redefine (1)
	    * "If there are any element information items among the [children]
	    * other than <annotation> then the `actual value` of the
	    * schemaLocation [attribute] must successfully resolve."
	    * TODO: Ask the WG if a the location has always to resolve
	    * here as well!
	    */
	    res = XML_SCHEMAP_SRC_REDEFINE;
	    xmlSchemaCustomErr(ACTXT_CAST pctxt, res,
		node, NULL,
		"Failed to load the document '%s' for redefinition",
		schemaLocation, NULL);
	}
    } else {
	/*
	* Check targetNamespace sanity before parsing the new schema.
	* TODO: Note that we won't check further content if the
	* targetNamespace was bad.
	*/
	if (bucket->origTargetNamespace != NULL) {
	    /*
	    * SPEC src-include (2.1)
	    * "SII has a targetNamespace [attribute], and its `actual
	    * value` is identical to the `actual value` of the targetNamespace
	    * [attribute] of SII' (which must have such an [attribute])."
	    */
	    if (pctxt->targetNamespace == NULL) {
		xmlSchemaCustomErr(ACTXT_CAST pctxt,
		    XML_SCHEMAP_SRC_INCLUDE,
		    node, NULL,
		    "The target namespace of the included/redefined schema "
		    "'%s' has to be absent, since the including/redefining "
		    "schema has no target namespace",
		    schemaLocation, NULL);
		goto exit_error;
	    } else if (!xmlStrEqual(bucket->origTargetNamespace,
		pctxt->targetNamespace)) {
		/* TODO: Change error function. */
		xmlSchemaPCustomErrExt(pctxt,
		    XML_SCHEMAP_SRC_INCLUDE,
		    NULL, node,
		    "The target namespace '%s' of the included/redefined "
		    "schema '%s' differs from '%s' of the "
		    "including/redefining schema",
		    bucket->origTargetNamespace, schemaLocation,
		    pctxt->targetNamespace);
		goto exit_error;
	    }
	} else if (pctxt->targetNamespace != NULL) {
	    /*
	    * Chameleons: the original target namespace will
	    * differ from the resulting namespace.
	    */
	    isChameleon = 1;
	    if (bucket->parsed &&
		bucket->origTargetNamespace != NULL) {
		xmlSchemaCustomErr(ACTXT_CAST pctxt,
		    XML_SCHEMAP_SRC_INCLUDE,
		    node, NULL,
		    "The target namespace of the included/redefined schema "
		    "'%s' has to be absent or the same as the "
		    "including/redefining schema's target namespace",
		    schemaLocation, NULL);
		goto exit_error;
	    }
	    bucket->targetNamespace = pctxt->targetNamespace;
	}
    }
    /*
    * Parse the schema.
    */
    if (bucket && (!bucket->parsed) && (bucket->doc != NULL)) {
	if (isChameleon) {
	    /* TODO: Get rid of this flag on the schema itself. */
	    if ((schema->flags & XML_SCHEMAS_INCLUDING_CONVERT_NS) == 0) {
		schema->flags |= XML_SCHEMAS_INCLUDING_CONVERT_NS;
	    } else
		wasChameleon = 1;
	}
	xmlSchemaParseNewDoc(pctxt, schema, bucket);
	/* Restore chameleon flag. */
	if (isChameleon && (!wasChameleon))
	    schema->flags ^= XML_SCHEMAS_INCLUDING_CONVERT_NS;
    }
    /*
    * And now for the children...
    */
    child = node->children;
    if (type == XML_SCHEMA_SCHEMA_REDEFINE) {
	/*
	* Parse (simpleType | complexType | group | attributeGroup))*
	*/
	pctxt->redefined = bucket;
	/*
	* How to proceed if the redefined schema was not located?
	*/
	pctxt->isRedefine = 1;
	while (IS_SCHEMA(child, "annotation") ||
	    IS_SCHEMA(child, "simpleType") ||
	    IS_SCHEMA(child, "complexType") ||
	    IS_SCHEMA(child, "group") ||
	    IS_SCHEMA(child, "attributeGroup")) {
	    if (IS_SCHEMA(child, "annotation")) {
		/*
		* TODO: discard or not?
		*/
	    } else if (IS_SCHEMA(child, "simpleType")) {
		xmlSchemaParseSimpleType(pctxt, schema, child, 1);
	    } else if (IS_SCHEMA(child, "complexType")) {
		xmlSchemaParseComplexType(pctxt, schema, child, 1);
		/* hasRedefinitions = 1; */
	    } else if (IS_SCHEMA(child, "group")) {
		/* hasRedefinitions = 1; */
		xmlSchemaParseModelGroupDefinition(pctxt,
		    schema, child);
	    } else if (IS_SCHEMA(child, "attributeGroup")) {
		/* hasRedefinitions = 1; */
		xmlSchemaParseAttributeGroupDefinition(pctxt, schema,
		    child);
	    }
	    child = child->next;
	}
	pctxt->redefined = NULL;
	pctxt->isRedefine = 0;
    } else {
	if (IS_SCHEMA(child, "annotation")) {
	    /*
	    * TODO: discard or not?
	    */
	    child = child->next;
	}
    }
    if (child != NULL) {
	res = XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED;
	if (type == XML_SCHEMA_SCHEMA_REDEFINE) {
	    xmlSchemaPContentErr(pctxt, res,
		NULL, node, child, NULL,
		"(annotation | (simpleType | complexType | group | attributeGroup))*");
	} else {
	     xmlSchemaPContentErr(pctxt, res,
		NULL, node, child, NULL,
		"(annotation?)");
	}
    }
    return(res);

exit_error:
    return(pctxt->err);
}